

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidyConfigDiffThanDefault(TidyDocImpl *doc)

{
  ctmbstr ptVar1;
  ctmbstr *pptVar2;
  TidyOptionValue *pTVar3;
  bool bVar4;
  
  pTVar3 = (doc->config).value;
  pptVar2 = &option_defs[2].name;
  do {
    if ((int)pptVar2[-6] == 0) {
      bVar4 = (ctmbstr)pTVar3->v == pptVar2[-2];
    }
    else {
      bVar4 = (ctmbstr)pTVar3->v == pptVar2[-5];
    }
    if (bVar4 == false) break;
    pTVar3 = pTVar3 + 1;
    ptVar1 = *pptVar2;
    pptVar2 = pptVar2 + 7;
  } while (ptVar1 != (ctmbstr)0x0);
  return (Bool)(bVar4 ^ 1);
}

Assistant:

Bool  TY_(ConfigDiffThanDefault)( TidyDocImpl* doc )
{
  Bool diff = no;
  const TidyOptionImpl* option = option_defs + 1;
  const TidyOptionValue* val = doc->config.value;
  for ( /**/; !diff && option && option->name; ++option, ++val )
  {
      diff = !OptionValueEqDefault( option, val );
  }
  return diff;
}